

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

void Fx_PrintMatrix(Fx_Man_t *p)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *__s;
  Vec_Int_t *p_00;
  char *pLine;
  int nObjs;
  int Lit;
  int v;
  int i;
  Vec_Int_t *vCube;
  Fx_Man_t *p_local;
  
  iVar2 = Vec_WecSize(p->vLits);
  if (iVar2 / 2 < 0x1b) {
    printf("         ");
    iVar2 = Vec_WecSize(p->vLits);
    iVar2 = iVar2 / 2;
    for (Lit = 0; iVar3 = Abc_MinInt(iVar2,0x1a), Lit < iVar3; Lit = Lit + 1) {
      printf("%c",(ulong)(Lit + 0x61));
    }
    printf("\n");
    __s = calloc((long)(iVar2 + 1),1);
    for (Lit = 0; iVar3 = Vec_WecSize(p->vCubes), Lit < iVar3; Lit = Lit + 1) {
      p_00 = Vec_WecEntry(p->vCubes,Lit);
      iVar3 = Vec_IntSize(p_00);
      if (iVar3 != 0) {
        memset(__s,0x2d,(long)iVar2);
        for (nObjs = 1; iVar3 = Vec_IntSize(p_00), nObjs < iVar3; nObjs = nObjs + 1) {
          iVar3 = Vec_IntEntry(p_00,nObjs);
          iVar4 = Abc_Lit2Var(iVar3);
          if (iVar2 <= iVar4) {
            __assert_fail("Abc_Lit2Var(Lit) < nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                          ,0x209,"void Fx_PrintMatrix(Fx_Man_t *)");
          }
          iVar4 = Abc_LitIsCompl(iVar3);
          uVar1 = 0x31;
          if (iVar4 != 0) {
            uVar1 = 0x30;
          }
          iVar3 = Abc_Lit2Var(iVar3);
          *(undefined1 *)((long)__s + (long)iVar3) = uVar1;
        }
        uVar5 = Vec_IntEntry(p_00,0);
        printf("%6d : %s %4d\n",(ulong)(uint)Lit,__s,(ulong)uVar5);
      }
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
    Fx_PrintLiterals(p);
    Fx_PrintDivisors(p);
  }
  return;
}

Assistant:

static void Fx_PrintMatrix( Fx_Man_t * p )
{
    Vec_Int_t * vCube;
    int i, v, Lit, nObjs;
    char * pLine;
    if ( Vec_WecSize(p->vLits)/2 > 26 )
        return;
    printf( "         " );
    nObjs = Vec_WecSize(p->vLits)/2;
    for ( i = 0; i < Abc_MinInt(nObjs, 26); i++ )
        printf( "%c", 'a' + i );
    printf( "\n" );
    pLine = ABC_CALLOC( char, nObjs+1 );
    Vec_WecForEachLevel( p->vCubes, vCube, i )
    {
        if ( Vec_IntSize(vCube) == 0 )
            continue;
        memset( pLine, '-', nObjs );
        Vec_IntForEachEntryStart( vCube, Lit, v, 1 )
        {
            assert( Abc_Lit2Var(Lit) < nObjs );
            pLine[Abc_Lit2Var(Lit)] = Abc_LitIsCompl(Lit) ? '0' : '1';
        }
        printf( "%6d : %s %4d\n", i, pLine, Vec_IntEntry(vCube, 0) );
    }
    ABC_FREE( pLine );
    Fx_PrintLiterals( p );
    Fx_PrintDivisors( p );
}